

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_3;
  ModuleHeaderSyntax *args_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  BumpAllocator *this;
  ModuleDeclarationSyntax *pMVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  ModuleHeaderSyntax *in_stack_ffffffffffffffa0;
  NamedBlockClauseSyntax *local_58;
  Token *args_4;
  
  args_4 = (Token *)__fn;
  args_3 = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  not_null<slang::syntax::ModuleHeaderSyntax_*>::operator*
            ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x7b92f8);
  args_2 = deepClone<slang::syntax::ModuleHeaderSyntax>
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  args_1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
           deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_00000050,in_stack_00000048
                     );
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  this = TVar2._0_8_;
  if (*(long *)(__fn + 0xa0) == 0) {
    local_58 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_58 = deepClone<slang::syntax::NamedBlockClauseSyntax>
                         ((NamedBlockClauseSyntax *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
  }
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::ModuleDeclarationSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ModuleHeaderSyntax&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     (this,(SyntaxKind *)local_58,args_1,args_2,
                      (SyntaxList<slang::syntax::MemberSyntax> *)args_3,args_4,
                      (NamedBlockClauseSyntax **)__child_stack);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const ModuleDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ModuleDeclarationSyntax>(
        node.kind,
        *deepClone(node.attributes, alloc),
        *deepClone<ModuleHeaderSyntax>(*node.header, alloc),
        *deepClone(node.members, alloc),
        node.endmodule.deepClone(alloc),
        node.blockName ? deepClone(*node.blockName, alloc) : nullptr
    );
}